

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSampleVerifierUtil.cpp
# Opt level: O0

void vkt::texture::util::anon_unknown_1::convertNormalizedFormat
               (void *pixelPtr,TextureFormat texFormat,FloatFormat internalFormat,Vec4 *resultMin,
               Vec4 *resultMax)

{
  int iVar1;
  FloatFormat internalFormat_00;
  deUint64 num;
  byte bVar2;
  uchar pack_00;
  unsigned_short pack_01;
  TextureChannelClass TVar3;
  uint pack_02;
  TextureSwizzle *pTVar4;
  float *pfVar5;
  int *piVar6;
  float *resultMax_00;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  double local_b0;
  deUint64 local_a8;
  deInt64 chanVal;
  deUint64 pack;
  deUint64 dStack_90;
  int chanBits;
  deUint64 chanUVal;
  Channel chan;
  int compNdx;
  undefined1 local_76;
  byte local_75;
  int local_74;
  bool isSrgb;
  bool isSigned;
  TextureFormat TStack_70;
  int ndx;
  byte local_65;
  int local_64;
  undefined1 local_60 [3];
  bool isPacked;
  int baseTypeBytes;
  IVec4 bitSizes;
  IVec4 bitOffsets;
  int chanSize;
  TextureChannelClass chanClass;
  TextureSwizzle readSwizzle;
  Vec4 *resultMax_local;
  Vec4 *resultMin_local;
  void *pixelPtr_local;
  TextureFormat texFormat_local;
  
  pixelPtr_local._0_4_ = texFormat.order;
  readSwizzle.components._8_8_ = resultMax;
  pTVar4 = tcu::getChannelReadSwizzle((ChannelOrder)pixelPtr_local);
  _chanSize = *(undefined8 *)pTVar4->components;
  readSwizzle.components._0_8_ = *(undefined8 *)(pTVar4->components + 2);
  pixelPtr_local._4_4_ = texFormat.type;
  TVar3 = tcu::getTextureChannelClass(pixelPtr_local._4_4_);
  bitOffsets.m_data[2] = -1;
  tcu::Vector<int,_4>::Vector((Vector<int,_4> *)(bitSizes.m_data + 2));
  tcu::Vector<int,_4>::Vector((Vector<int,_4> *)local_60);
  local_64 = -1;
  local_65 = isPackedType(pixelPtr_local._4_4_);
  if ((bool)local_65) {
    TStack_70 = texFormat;
    getPackInfo(texFormat,(IVec4 *)local_60,(IVec4 *)(bitSizes.m_data + 2),&local_64);
    if ((pixelPtr_local._4_4_ == UNORM_INT_1010102_REV) ||
       (pixelPtr_local._4_4_ == SNORM_INT_1010102_REV)) {
      for (local_74 = 0; local_74 < 2; local_74 = local_74 + 1) {
        std::swap<tcu::TextureSwizzle::Channel>
                  ((Channel *)(&chanSize + local_74),(Channel *)(&chanSize + (3 - local_74)));
      }
    }
  }
  else {
    bitOffsets.m_data[2] = tcu::getChannelSize(pixelPtr_local._4_4_);
  }
  local_75 = TVar3 == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT;
  _chan = texFormat;
  local_76 = tcu::isSRGB(texFormat);
  for (chanUVal._4_4_ = 0; chanUVal._4_4_ < 4; chanUVal._4_4_ = chanUVal._4_4_ + 1) {
    chanUVal._0_4_ = (&chanSize)[chanUVal._4_4_];
    if ((int)chanUVal == 4) {
      pfVar5 = tcu::Vector<float,_4>::operator[](resultMin,chanUVal._4_4_);
      *pfVar5 = 0.0;
      pfVar5 = tcu::Vector<float,_4>::operator[]
                         ((Vector<float,_4> *)readSwizzle.components._8_8_,chanUVal._4_4_);
      *pfVar5 = 0.0;
    }
    else if ((int)chanUVal == 5) {
      pfVar5 = tcu::Vector<float,_4>::operator[](resultMin,chanUVal._4_4_);
      *pfVar5 = 1.0;
      pfVar5 = tcu::Vector<float,_4>::operator[]
                         ((Vector<float,_4> *)readSwizzle.components._8_8_,chanUVal._4_4_);
      *pfVar5 = 1.0;
    }
    else {
      dStack_90 = 0;
      pack._4_4_ = 0;
      if ((local_65 & 1) == 0) {
        dStack_90 = readChannel(pixelPtr,(int)chanUVal * bitOffsets.m_data[2],bitOffsets.m_data[2]);
        pack._4_4_ = bitOffsets.m_data[2] << 3;
      }
      else {
        chanVal = readChannel(pixelPtr,0,local_64);
        piVar6 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)local_60,(int)chanUVal);
        pack._4_4_ = *piVar6;
        if (local_64 == 1) {
          pack_00 = (uchar)chanVal;
          piVar6 = tcu::Vector<int,_4>::operator[]
                             ((Vector<int,_4> *)(bitSizes.m_data + 2),(int)chanUVal);
          iVar1 = *piVar6;
          piVar6 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)local_60,(int)chanUVal);
          dStack_90 = unpackBits<unsigned_char>(pack_00,iVar1,*piVar6);
        }
        else if (local_64 == 2) {
          pack_01 = (unsigned_short)chanVal;
          piVar6 = tcu::Vector<int,_4>::operator[]
                             ((Vector<int,_4> *)(bitSizes.m_data + 2),(int)chanUVal);
          iVar1 = *piVar6;
          piVar6 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)local_60,(int)chanUVal);
          dStack_90 = unpackBits<unsigned_short>(pack_01,iVar1,*piVar6);
        }
        else if (local_64 == 4) {
          pack_02 = (uint)chanVal;
          piVar6 = tcu::Vector<int,_4>::operator[]
                             ((Vector<int,_4> *)(bitSizes.m_data + 2),(int)chanUVal);
          iVar1 = *piVar6;
          piVar6 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)local_60,(int)chanUVal);
          dStack_90 = unpackBits<unsigned_int>(pack_02,iVar1,*piVar6);
        }
      }
      local_a8 = 0;
      if ((local_75 & 1) == 0) {
        local_a8 = dStack_90;
      }
      else {
        local_a8 = signExtend(dStack_90,pack._4_4_);
      }
      bVar2 = local_75;
      iVar1 = pack._4_4_;
      num = local_a8;
      memcpy(&local_d0,&internalFormat,0x28);
      pfVar5 = tcu::Vector<float,_4>::operator[](resultMin,chanUVal._4_4_);
      resultMax_00 = tcu::Vector<float,_4>::operator[]
                               ((Vector<float,_4> *)readSwizzle.components._8_8_,chanUVal._4_4_);
      internalFormat_00.m_fractionBits = (undefined4)uStack_c8;
      internalFormat_00.m_hasSubnormal = uStack_c8._4_4_;
      internalFormat_00.m_minExp = (undefined4)local_d0;
      internalFormat_00.m_maxExp = local_d0._4_4_;
      internalFormat_00.m_hasInf = (undefined4)local_c0;
      internalFormat_00.m_hasNaN = local_c0._4_4_;
      internalFormat_00._24_8_ = uStack_b8;
      internalFormat_00.m_maxValue = local_b0;
      convertNormalizedInt(num,iVar1,(bool)(bVar2 & 1),internalFormat_00,pfVar5,resultMax_00);
    }
  }
  return;
}

Assistant:

void convertNormalizedFormat (const void*	pixelPtr,
							  TextureFormat	texFormat,
							  FloatFormat	internalFormat,
							  Vec4&			resultMin,
							  Vec4&			resultMax)
{
    TextureSwizzle				readSwizzle	= getChannelReadSwizzle(texFormat.order);
	const TextureChannelClass	chanClass	= getTextureChannelClass(texFormat.type);

	DE_ASSERT(getTextureChannelClass(texFormat.type) < 2);

	// Information for non-packed types
	int chanSize = -1;

	// Information for packed types
	IVec4 bitOffsets;
	IVec4 bitSizes;
	int baseTypeBytes = -1;

	const bool isPacked = isPackedType(texFormat.type);

	if (isPacked)
	{
		getPackInfo(texFormat, bitSizes, bitOffsets, baseTypeBytes);

		// Kludge to work around deficiency in framework

		if (texFormat.type == TextureFormat::UNORM_INT_1010102_REV ||
			texFormat.type == TextureFormat::SNORM_INT_1010102_REV)
		{
			for (int ndx = 0; ndx < 2; ++ndx)
			{
				std::swap(readSwizzle.components[ndx], readSwizzle.components[3 - ndx]);
			}
		}

		DE_ASSERT(baseTypeBytes == 1 || baseTypeBytes == 2 || baseTypeBytes == 4);
	}
	else
	{
		chanSize = getChannelSize(texFormat.type);
	}

	const bool	isSigned = (chanClass == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT);
	const bool	isSrgb	 = isSRGB(texFormat);

	// \todo [2016-08-01 collinbaker] Handle sRGB with correct rounding
	DE_ASSERT(!isSrgb);
	DE_UNREF(isSrgb);

	for (int compNdx = 0; compNdx < 4; ++compNdx)
	{
		const TextureSwizzle::Channel chan = readSwizzle.components[compNdx];

		if (chan == TextureSwizzle::CHANNEL_ZERO)
		{
			resultMin[compNdx] = 0.0f;
			resultMax[compNdx] = 0.0f;
		}
		else if (chan == TextureSwizzle::CHANNEL_ONE)
		{
			resultMin[compNdx] = 1.0f;
			resultMax[compNdx] = 1.0f;
		}
		else
		{
			deUint64 chanUVal = 0;
			int chanBits = 0;

			if (isPacked)
			{
				deUint64 pack = readChannel(pixelPtr, 0, baseTypeBytes);
				chanBits = bitSizes[chan];

				switch (baseTypeBytes)
				{
					case 1:
						chanUVal = unpackBits<deUint8>((deUint8)pack, bitOffsets[chan], bitSizes[chan]);
						break;

					case 2:
						chanUVal = unpackBits<deUint16>((deUint16)pack, bitOffsets[chan], bitSizes[chan]);
						break;

					case 4:
						chanUVal = unpackBits<deUint32>((deUint32)pack, bitOffsets[chan], bitSizes[chan]);
						break;

					default:
						break;
				}
			}
			else
			{
			    chanUVal = readChannel(pixelPtr, chan * chanSize, chanSize);
				chanBits = 8 * chanSize;
			}

			deInt64 chanVal = 0;

			if (isSigned)
			{
				chanVal = signExtend(chanUVal, chanBits);
			}
			else
			{
				chanVal = (deInt64) chanUVal;
			}

			convertNormalizedInt(chanVal, chanBits, isSigned, internalFormat, resultMin[compNdx], resultMax[compNdx]);
		}
	}
}